

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileOptions *orig_options,FileDescriptor *descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (descriptor + 8),".dummy");
  AllocateOptionsImpl<google::protobuf::FileDescriptor>
            (this,&local_40,*(string **)descriptor,orig_options,descriptor);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileOptions& orig_options,
                                        FileDescriptor* descriptor) {
  // We add the dummy token so that LookupSymbol does the right thing.
  AllocateOptionsImpl(descriptor->package() + ".dummy", descriptor->name(),
                      orig_options, descriptor);
}